

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          align_spec *spec,inf_or_nan_writer *f)

{
  byte bVar1;
  undefined2 uVar2;
  undefined8 *puVar3;
  long lVar4;
  size_t size;
  char *__s;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  basic_buffer<char> *c;
  ulong uVar8;
  char __tmp;
  size_t __len;
  size_t __n;
  
  uVar6 = (ulong)spec->width_;
  uVar7 = 4 - (ulong)(f->sign == '\0');
  puVar3 = *(undefined8 **)this;
  lVar4 = puVar3[2];
  __n = uVar6 - uVar7;
  if (uVar6 < uVar7 || __n == 0) {
    uVar7 = uVar7 + lVar4;
    if ((ulong)puVar3[3] < uVar7) {
      (**(code **)*puVar3)(puVar3,uVar7);
    }
    puVar3[2] = uVar7;
    pcVar5 = (char *)(lVar4 + puVar3[1]);
LAB_0011ad9c:
    if (f->sign != '\0') {
      *pcVar5 = f->sign;
      pcVar5 = pcVar5 + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    pcVar5[2] = f->str[2];
    *(undefined2 *)pcVar5 = uVar2;
    return;
  }
  uVar8 = lVar4 + uVar6;
  if ((ulong)puVar3[3] < uVar8) {
    (**(code **)*puVar3)(puVar3,uVar8);
  }
  puVar3[2] = uVar8;
  __s = (char *)(lVar4 + puVar3[1]);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar8 = __n >> 1;
    if (1 < __n) {
      memset(__s,(uint)bVar1,uVar8);
      __s = __s + uVar8;
    }
    if (f->sign != '\0') {
      *__s = f->sign;
      __s = __s + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    __s[2] = f->str[2];
    *(undefined2 *)__s = uVar2;
    if (uVar6 == uVar7) {
      return;
    }
    __n = __n - uVar8;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pcVar5 = __s;
      if (uVar6 != uVar7) {
        pcVar5 = __s + __n;
        memset(__s,(uint)bVar1,__n);
      }
      goto LAB_0011ad9c;
    }
    if (f->sign != '\0') {
      *__s = f->sign;
      __s = __s + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    __s[2] = f->str[2];
    *(undefined2 *)__s = uVar2;
    if (uVar6 == uVar7) {
      return;
    }
  }
  memset(__s + 3,(uint)bVar1,__n);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }